

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall Clone_variable_Test::TestBody(Clone_variable_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs;
  type *in_stack_fffffffffffffa08;
  AssertHelper local_4b8 [8];
  Message local_4b0 [8];
  string local_4a8 [32];
  undefined1 local_488 [8];
  AssertionResult gtest_ar_10;
  Message local_470 [8];
  string local_468 [32];
  undefined1 local_448 [8];
  AssertionResult gtest_ar_9;
  Message local_430 [8];
  string local_428 [32];
  undefined1 local_408 [8];
  AssertionResult gtest_ar_8;
  Message local_3f0 [8];
  string local_3e8 [32];
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_7;
  Message local_3b0 [8];
  shared_ptr<libcellml::Units> local_3a8;
  shared_ptr<libcellml::Units> local_398;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_6;
  string local_370 [39];
  allocator<char> local_349;
  string local_348 [39];
  allocator<char> local_321;
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [39];
  allocator<char> local_2d1;
  string local_2d0 [32];
  AssertHelper local_2b0 [8];
  Message local_2a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280 [32];
  undefined1 local_260 [8];
  AssertionResult gtest_ar_5;
  Message local_248 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220 [32];
  undefined1 local_200 [8];
  AssertionResult gtest_ar_4;
  Message local_1e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0 [32];
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_3;
  Message local_188 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160 [32];
  undefined1 local_140 [8];
  AssertionResult gtest_ar_2;
  Message local_128 [8];
  shared_ptr<libcellml::Units> local_120;
  shared_ptr<libcellml::Units> local_110;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8 [8];
  shared_ptr<libcellml::ParentedEntity> local_e0;
  char local_d0 [8];
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  VariablePtr vClone;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  VariablePtr v;
  Clone_variable_Test *this_local;
  
  v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  libcellml::Variable::create();
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"lightning",&local_41);
  libcellml::Variable::setUnits((string *)peVar2);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Variable::setInitialValue(-3.0);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Variable::setInterfaceType((InterfaceType)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"id_unique",&local_79);
  libcellml::Entity::setId((string *)peVar2);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"variable",
             (allocator<char> *)
             ((long)&vClone.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&vClone.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Variable::clone();
  local_d0[0] = '\0';
  local_d0[1] = '\0';
  local_d0[2] = '\0';
  local_d0[3] = '\0';
  local_d0[4] = '\0';
  local_d0[5] = '\0';
  local_d0[6] = '\0';
  local_d0[7] = '\0';
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::ParentedEntity::parent();
  rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::ParentedEntity>>
            ((AssertionResult *)local_c8,(EqHelper<true> *)"nullptr","vClone->parent()",local_d0,
             (void **)&local_e0,(shared_ptr<libcellml::ParentedEntity> *)0x0,
             in_stack_fffffffffffffa08);
  std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr(&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Variable::units();
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Variable::units();
  testing::internal::
  CmpHelperNE<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((AssertionResult *)local_100,(internal *)"v->units()","vClone->units()",
             (char *)&local_110,&local_120,(shared_ptr<libcellml::Units> *)rhs);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_120);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(local_128);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x81,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Variable::initialValue_abi_cxx11_();
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Variable::initialValue_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_140,(EqHelper<false> *)"v->initialValue()",
             "vClone->initialValue()",(char *)local_160,&local_180,rhs);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string(local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(local_188);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Variable::interfaceType_abi_cxx11_();
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_1a0,(EqHelper<false> *)"v->interfaceType()",
             "vClone->interfaceType()",(char *)local_1c0,&local_1e0,rhs);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string(local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(local_1e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x83,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Entity::id_abi_cxx11_();
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_200,(EqHelper<false> *)"v->id()","vClone->id()",
             (char *)local_220,&local_240,rhs);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string(local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(local_248);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::NamedEntity::name_abi_cxx11_();
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_260,(EqHelper<false> *)"v->name()","vClone->name()",
             (char *)local_280,&local_2a0,rhs);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string(local_280);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(local_2a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              (local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x85,pcVar3);
    testing::internal::AssertHelper::operator=(local_2b0,local_2a8);
    testing::internal::AssertHelper::~AssertHelper(local_2b0);
    testing::Message::~Message(local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"on_my_own",&local_2d1);
  libcellml::Variable::setUnits((string *)peVar2);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"45.0",&local_2f9);
  libcellml::Variable::setInitialValue((string *)peVar2);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_320,"public",&local_321);
  libcellml::Variable::setInterfaceType((string *)peVar2);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_348,"unique_again",&local_349);
  libcellml::Entity::setId((string *)peVar2);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator(&local_349);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_370,"on_my_own",(allocator<char> *)&gtest_ar_6.field_0xf);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&gtest_ar_6.field_0xf);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Variable::units();
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Variable::units();
  testing::internal::
  CmpHelperNE<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((AssertionResult *)local_388,(internal *)"v->units()","vClone->units()",
             (char *)&local_398,&local_3a8,(shared_ptr<libcellml::Units> *)rhs);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_3a8);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_398);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar1) {
    testing::Message::Message(local_3b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x8d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Variable::initialValue_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[3]>
            ((AssertionResult *)local_3c8,(EqHelper<false> *)"v->initialValue()","\"-3\"",
             (char *)local_3e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"-3",
             (char (*) [3])rhs);
  std::__cxx11::string::~string(local_3e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(local_3f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[8]>
            ((AssertionResult *)local_408,(EqHelper<false> *)"v->interfaceType()","\"private\"",
             (char *)local_428,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"private",
             (char (*) [8])rhs);
  std::__cxx11::string::~string(local_428);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(local_430);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x8f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[10]>
            ((AssertionResult *)local_448,(EqHelper<false> *)"v->id()","\"id_unique\"",
             (char *)local_468,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"id_unique",
             (char (*) [10])rhs);
  std::__cxx11::string::~string(local_468);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(local_470);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x90,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,local_470);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[9]>
            ((AssertionResult *)local_488,(EqHelper<false> *)"v->name()","\"variable\"",
             (char *)local_4a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"variable",
             (char (*) [9])rhs);
  std::__cxx11::string::~string(local_4a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(local_4b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              (local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x91,pcVar3);
    testing::internal::AssertHelper::operator=(local_4b8,local_4b0);
    testing::internal::AssertHelper::~AssertHelper(local_4b8);
    testing::Message::~Message(local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_20);
  return;
}

Assistant:

TEST(Clone, variable)
{
    auto v = libcellml::Variable::create();
    v->setUnits("lightning");
    v->setInitialValue(-3.0);
    v->setInterfaceType(libcellml::Variable::InterfaceType::PRIVATE);
    v->setId("id_unique");
    v->setName("variable");

    auto vClone = v->clone();

    EXPECT_EQ(nullptr, vClone->parent());
    EXPECT_NE(v->units(), vClone->units());
    EXPECT_EQ(v->initialValue(), vClone->initialValue());
    EXPECT_EQ(v->interfaceType(), vClone->interfaceType());
    EXPECT_EQ(v->id(), vClone->id());
    EXPECT_EQ(v->name(), vClone->name());

    vClone->setUnits("on_my_own");
    vClone->setInitialValue("45.0");
    vClone->setInterfaceType("public");
    vClone->setId("unique_again");
    vClone->setName("on_my_own");

    EXPECT_NE(v->units(), vClone->units());
    EXPECT_EQ(v->initialValue(), "-3");
    EXPECT_EQ(v->interfaceType(), "private");
    EXPECT_EQ(v->id(), "id_unique");
    EXPECT_EQ(v->name(), "variable");
}